

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

void __thiscall
pbrt::GPUFloatPtexTexture::GPUFloatPtexTexture
          (GPUFloatPtexTexture *this,string *filename,ColorEncoding *encoding,Float scale,
          Allocator alloc)

{
  TextureEvalContext ctx_00;
  undefined1 auVar1 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [64];
  undefined8 uVar6;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  long *in_FS_OFFSET;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  TextureEvalContext ctx;
  Float filterWidth;
  int i;
  int nFaces;
  PtexTexture *texture;
  String error;
  FloatPtexTexture tex;
  float in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  Float in_stack_fffffffffffffd8c;
  ColorEncoding *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  reference in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  Float in_stack_fffffffffffffdc4;
  int iVar9;
  undefined4 uVar10;
  string *this_00;
  undefined1 local_1ec [52];
  undefined1 auStack_1b8 [12];
  Point2f local_168;
  undefined1 local_120 [64];
  undefined1 auStack_e0 [12];
  Float local_d4;
  int local_d0;
  undefined1 local_cc [28];
  int local_b0;
  int local_ac;
  long *local_a8;
  string local_a0 [112];
  polymorphic_allocator<float> local_30 [6];
  undefined1 auVar2 [40];
  
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(in_RDI,local_30);
  ColorEncoding::ColorEncoding
            ((ColorEncoding *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (ColorEncoding *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  FloatPtexTexture::FloatPtexTexture
            ((FloatPtexTexture *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
  this_00 = local_a0;
  std::__cxx11::string::string(this_00);
  iVar9 = (int)cache;
  uVar10 = (undefined4)((ulong)cache >> 0x20);
  uVar6 = std::__cxx11::string::c_str();
  local_a8 = (long *)(**(code **)(*(long *)CONCAT44(uVar10,iVar9) + 0x28))
                               ((long *)CONCAT44(uVar10,iVar9),uVar6,this_00);
  if (local_a8 == (long *)0x0) {
    LogFatal<char_const(&)[8]>
              ((LogLevel)((ulong)this_00 >> 0x20),(char *)CONCAT44(uVar10,iVar9),
               (int)in_stack_fffffffffffffdc4,(char *)in_stack_fffffffffffffdb8,
               (char (*) [8])CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  (**(code **)(*local_a8 + 0x20))(local_cc);
  local_ac = local_b0;
  (**(code **)(*local_a8 + 0x10))();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
            (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98);
  for (local_d0 = 0; local_d0 < local_ac; local_d0 = local_d0 + 1) {
    local_d4 = 0.75;
    Point3<float>::Point3((Point3<float> *)0x5ca45e);
    Vector3<float>::Vector3((Vector3<float> *)0x5ca482);
    Vector3<float>::Vector3((Vector3<float> *)0x5ca4a6);
    Normal3<float>::Normal3((Normal3<float> *)0x5ca4ca);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
    TextureEvalContext::TextureEvalContext
              ((TextureEvalContext *)local_120,(Point3f)ZEXT812(0),(Vector3f)ZEXT812(0),
               (Vector3f)ZEXT812(0),(Normal3f)ZEXT812(0),local_168,local_d4,local_d4,local_d4,
               local_d4,local_d0);
    auVar7._12_52_ = local_120._12_52_;
    auVar7._0_12_ = local_120._0_12_;
    auVar7 = vmovdqu64_avx512f(auVar7);
    auVar5._52_12_ = auStack_e0;
    auVar5._0_52_ = local_120._12_52_;
    auVar8 = vmovdqu64_avx512f(auVar5);
    auVar8 = vmovdqu64_avx512f(auVar8);
    auStack_1b8 = auVar8._52_12_;
    auVar8 = vmovdqu64_avx512f(auVar7);
    local_1ec = auVar8._12_52_;
    auVar7 = vmovdqu64_avx512f(auVar8);
    auVar8._52_12_ = auStack_1b8;
    auVar8._0_52_ = local_1ec;
    auVar8 = vmovdqu64_avx512f(auVar8);
    auVar8 = vmovdqu64_avx512f(auVar8);
    auVar7 = vmovdqu64_avx512f(auVar7);
    in_stack_fffffffffffffd68 = auVar7._0_4_;
    in_stack_fffffffffffffd6c = auVar7._4_4_;
    in_stack_fffffffffffffd70 = auVar7._8_4_;
    in_stack_fffffffffffffd74 = auVar7._12_4_;
    auVar2 = auVar7._24_40_;
    ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)auVar8._52_8_;
    ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)((ulong)auVar8._52_8_ >> 0x20);
    auVar1 = auVar2._0_12_;
    auVar3 = auVar2._12_12_;
    auVar4 = auVar2._24_12_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar1._0_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar1._4_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar1._8_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar3._0_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar3._4_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar3._8_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar4._0_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar4._4_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar4._8_4_;
    ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar2._36_4_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar8._60_4_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffdb4;
    ctx_00._56_8_ = in_stack_fffffffffffffdb8;
    ctx_00.dvdx = (Float)in_stack_fffffffffffffdc0;
    ctx_00.dvdy = in_stack_fffffffffffffdc4;
    ctx_00.faceIndex = iVar9;
    in_stack_fffffffffffffdc4 = Evaluate(auVar7._8_8_,ctx_00);
    in_stack_fffffffffffffdb8 =
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (in_RDI,(long)local_d0);
    *in_stack_fffffffffffffdb8 = in_stack_fffffffffffffdc4;
  }
  *(long *)(*in_FS_OFFSET + -0x4a0) = (long)local_ac * 4 + *(long *)(*in_FS_OFFSET + -0x4a0);
  std::__cxx11::string::~string(local_a0);
  FloatPtexTexture::~FloatPtexTexture((FloatPtexTexture *)0x5ca6ca);
  return;
}

Assistant:

GPUFloatPtexTexture::GPUFloatPtexTexture(const std::string &filename,
                                         ColorEncoding encoding, Float scale,
                                         Allocator alloc)
    : faceValues(alloc) {
    FloatPtexTexture tex(filename, encoding, scale);

    Ptex::String error;
    Ptex::PtexTexture *texture = cache->get(filename.c_str(), error);
    CHECK(texture);
    int nFaces = texture->getInfo().numFaces;
    texture->release();

    faceValues.resize(nFaces);
    for (int i = 0; i < nFaces; ++i) {
        Float filterWidth = 0.75f;
        TextureEvalContext ctx(Point3f(), Vector3f(), Vector3f(), Normal3f(),
                               Point2f(0.5f, 0.5f), filterWidth, filterWidth, filterWidth,
                               filterWidth, i);
        faceValues[i] = Evaluate(ctx);
    }

    gpuPtexMemoryUsed += nFaces * sizeof(faceValues[0]);
}